

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O0

ssize_t __thiscall
Server::Private::ClientImpl::write(ClientImpl *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  usize *extraout_RAX;
  usize *extraout_RAX_00;
  usize *extraout_RAX_01;
  usize *puVar3;
  usize uVar4;
  uint flags;
  undefined4 in_register_00000034;
  int in_R8D;
  ClientImpl *local_40;
  usize *local_38;
  ssize sent;
  usize *postponed_local;
  usize size_local;
  byte *data_local;
  ClientImpl *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  sent = __n;
  postponed_local = (usize *)__buf;
  data_local = (byte *)this;
  bVar1 = Buffer::isEmpty(&this->_sendBuffer);
  if (bVar1) {
    local_38 = (usize *)Socket::send(&this->super_Socket,(int)size_local,postponed_local,__n,in_R8D)
    ;
    if (local_38 == (usize *)0xffffffffffffffff) {
      iVar2 = Socket::getLastError();
      if (iVar2 != 0) goto LAB_001156e8;
      local_38 = (usize *)0x0;
    }
    else if (local_38 == (usize *)0x0) {
LAB_001156e8:
      if (sent != 0) {
        *(undefined8 *)sent = 0;
      }
      local_40 = this;
      HashSet<Server::Private::ClientImpl_*>::append(&this->_p->_closingClients,&local_40);
      this_local._7_1_ = 0;
      local_38 = extraout_RAX;
      goto LAB_001157bd;
    }
    if (postponed_local <= local_38) {
      if (sent != 0) {
        *(undefined8 *)sent = 0;
        local_38 = (usize *)sent;
      }
      this_local._7_1_ = 1;
      goto LAB_001157bd;
    }
    Buffer::append(&this->_sendBuffer,(byte *)(size_local + (long)local_38),
                   (long)postponed_local - (long)local_38);
    flags = 3;
    if ((this->_suspended & 1U) != 0) {
      flags = 2;
    }
    Socket::Poll::set(&this->_p->_sockets,&this->super_Socket,flags);
    puVar3 = extraout_RAX_00;
  }
  else {
    Buffer::append(&this->_sendBuffer,(byte *)size_local,(usize)postponed_local);
    puVar3 = extraout_RAX_01;
  }
  if (sent != 0) {
    uVar4 = Buffer::size(&this->_sendBuffer);
    *(usize *)sent = uVar4;
    puVar3 = (usize *)sent;
  }
  local_38 = puVar3;
  this_local._7_1_ = 1;
LAB_001157bd:
  return CONCAT71((int7)((ulong)local_38 >> 8),this_local._7_1_);
}

Assistant:

bool Server::Private::ClientImpl::write(const byte *data, usize size, usize *postponed)
{
  if (_sendBuffer.isEmpty())
  {
    ssize sent = send(data, size);
    switch (sent)
    {
    case -1:
      if (Socket::getLastError() == 0) // EWOULDBLOCK
      {
        sent = 0;
        break;
      }
      // no break
    case 0:
      if (postponed)
        *postponed = 0;
      _p._closingClients.append(this);
      return false;
    default:
      break;
    }
    if ((usize)sent >= size)
    {
      if (postponed)
        *postponed = 0;
      return true;
    }
    _sendBuffer.append(data + sent, size - sent);
    _p._sockets.set(*this, _suspended ? Socket::Poll::writeFlag : (Socket::Poll::readFlag | Socket::Poll::writeFlag));
  }
  else
    _sendBuffer.append(data, size);
  if (postponed)
    *postponed = _sendBuffer.size();
  return true;
}